

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *matrix)

{
  long lVar1;
  complex<float> *pcVar2;
  int64_t i;
  ulong uVar3;
  ulong __n;
  
  lVar1 = matrix->size_;
  this->size_ = lVar1;
  if (lVar1 != 0) {
    __n = lVar1 * lVar1 * 8;
    uVar3 = 0;
    pcVar2 = (complex<float> *)operator_new__(-(ulong)((ulong)(lVar1 * lVar1) >> 0x3d != 0) | __n);
    memset(pcVar2,0,__n);
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = pcVar2;
    pcVar2 = (matrix->data_)._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    do {
      (this->data_)._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[uVar3]._M_value =
           pcVar2[uVar3]._M_value;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(this->size_ * this->size_));
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                ,0x12,
                "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<float>]");
}

Assistant:

inline int64_t size() const { return size_ ; }